

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_semacheck2.c
# Opt level: O2

void free_postfix_subexpr(gnode_postfix_subexpr_t *subnode)

{
  uint32_t uVar1;
  ulong uVar2;
  gnode_r *pgVar3;
  gnode_t *pgVar4;
  size_t _i;
  ulong uVar5;
  
  uVar1 = (subnode->base).refcount;
  if (uVar1 != 0) {
    (subnode->base).refcount = uVar1 - 1;
    return;
  }
  pgVar4 = (gnode_t *)(subnode->field_1).args;
  if ((subnode->base).tag == NODE_CALL_EXPR) {
    if (pgVar4 != (gnode_t *)0x0) {
      uVar2._0_4_ = pgVar4->tag;
      uVar2._4_4_ = pgVar4->refcount;
      for (uVar5 = 0; pgVar3 = (subnode->field_1).args, uVar2 != uVar5; uVar5 = uVar5 + 1) {
        if (uVar5 < pgVar3->n) {
          pgVar4 = pgVar3->p[uVar5];
        }
        else {
          pgVar4 = (gnode_t *)0x0;
        }
        gnode_free(pgVar4);
      }
      free(pgVar3->p);
      free((subnode->field_1).expr);
    }
  }
  else {
    gnode_free(pgVar4);
  }
  free(subnode);
  return;
}

Assistant:

static void free_postfix_subexpr (gnode_postfix_subexpr_t *subnode) {
    // check refcount
    if (subnode->base.refcount > 0) {--subnode->base.refcount; return;}

    // manually free postfix subnode
    gnode_n tag = subnode->base.tag;
    if (tag == NODE_CALL_EXPR) {
        if (subnode->args) {
            gnode_array_each(subnode->args, gnode_free(val););
            gnode_array_free(subnode->args);
        }
    } else {
        gnode_free(subnode->expr);
    }

    mem_free((gnode_t*)subnode);
}